

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log.cpp
# Opt level: O3

void duckdb::DuckDBLogFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  LogStorage *pLVar2;
  type pLVar3;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[1]._vptr_GlobalTableFunctionState != (_func_int **)0x0) {
    pLVar2 = shared_ptr<duckdb::LogStorage,_true>::operator->
                       ((shared_ptr<duckdb::LogStorage,_true> *)(pGVar1 + 1));
    pLVar3 = unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
             ::operator*((unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
                          *)(pGVar1 + 3));
    (*pLVar2->_vptr_LogStorage[7])(pLVar2,pLVar3,output,pLVar2->_vptr_LogStorage[7]);
    return;
  }
  return;
}

Assistant:

void DuckDBLogFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBLogData>();
	if (data.log_storage) {
		data.log_storage->ScanEntries(*data.scan_state, output);
	}
}